

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

void jumpscopeerror(LexState *ls,Labeldesc *gt)

{
  long lVar1;
  char *msg;
  char **ppcVar2;
  long lVar3;
  
  lVar1 = *(long *)((long)(ls->fs->ls->dyd->actvar).arr +
                   ((long)ls->fs->firstlocal + (ulong)gt->nactvar) * 0x18 + 0x10);
  lVar3 = lVar1 + 0x18;
  if (*(char *)(lVar1 + 0xb) < '\0') {
    lVar3 = *(long *)lVar3;
  }
  ppcVar2 = &gt->name->contents;
  if (gt->name->shrlen < '\0') {
    ppcVar2 = (char **)*ppcVar2;
  }
  msg = luaO_pushfstring(ls->L,"<goto %s> at line %d jumps into the scope of local \'%s\'",ppcVar2,
                         (ulong)(uint)gt->line,lVar3);
  luaK_semerror(ls,msg);
}

Assistant:

static l_noret jumpscopeerror (LexState *ls, Labeldesc *gt) {
  TString *tsname = getlocalvardesc(ls->fs, gt->nactvar)->vd.name;
  const char *varname = getstr(tsname);
  const char *msg = "<goto %s> at line %d jumps into the scope of local '%s'";
  msg = luaO_pushfstring(ls->L, msg, getstr(gt->name), gt->line, varname);
  luaK_semerror(ls, msg);  /* raise the error */
}